

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

void __thiscall OpenMD::FragmentStamp::checkBends(FragmentStamp *this)

{
  int iVar1;
  _Head_base<2UL,_int,_false> _Var2;
  long lVar3;
  pointer piVar4;
  pointer pcVar5;
  bool bVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  long lVar9;
  _Alloc_hider _Var10;
  pointer ppBVar11;
  iterator iVar12;
  ostream *poVar13;
  OpenMDException *pOVar14;
  int __tmp;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  ulong uVar15;
  long lVar16;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  size_t ghostIndex;
  vector<int,_std::allocator<int>_> bendAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  tuple<int,_int,_int> bendTuple;
  ostringstream oss;
  undefined1 local_248 [32];
  _Base_ptr local_228;
  size_t local_220;
  string local_218;
  FragmentStamp *local_1f8;
  string local_1f0;
  vector<int,_std::allocator<int>_> local_1d0;
  key_type local_1b4;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppBVar11 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar11) {
    lVar16 = 0;
    uVar15 = 0;
    local_1f8 = this;
    do {
      lVar3 = *(long *)((long)ppBVar11 + (lVar16 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,
                 (vector<int,_std::allocator<int>_> *)(lVar3 + 0x98));
      local_248._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1f0._M_dataplus._M_p,local_1f0._M_string_length,local_248);
      local_248._0_8_ = (pointer)0x0;
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                        (local_1f0._M_dataplus._M_p,local_1f0._M_string_length,local_248);
      this = local_1f8;
      if ((_Var7._M_current != (int *)local_1f0._M_string_length) ||
         (_Var8._M_current != (int *)local_1f0._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_218,(OpenMD *)&local_1f0,cont_00);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_218._M_dataplus._M_p,local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," have invalid indices\n",0x16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,(string *)local_248);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar6 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&local_1f0);
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_218,(OpenMD *)&local_1f0,cont_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_218._M_dataplus._M_p,local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," have duplicated indices\n",0x19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,(string *)local_248);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar9 = (long)(local_1f0._M_string_length - (long)local_1f0._M_dataplus._M_p) >> 2;
      if (lVar9 == 3) {
        if (*(char *)(lVar3 + 0x92) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,": normal bend should not have ghostVectorSouce\n",0x2f);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)local_248);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      else if (lVar9 == 2) {
        if (*(char *)(lVar3 + 0x92) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,": ghostVectorSouce is missing\n",0x1e);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)local_248);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_218._M_dataplus._M_p = (pointer)(long)*(int *)(lVar3 + 0x94);
        if ((char *)((long)(this->atomStamps_).
                           super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->atomStamps_).
                           super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) <=
            local_218._M_dataplus._M_p) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ghostVectorSource ",0x14);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  is invalid\n",0xd);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)local_248);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          (local_1f0._M_dataplus._M_p,local_1f0._M_string_length,&local_218);
        if (_Var7._M_current == (int *)local_1f0._M_string_length) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ghostVectorSouce ",0x13);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"is invalid\n",0xb);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)local_248);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        if ((this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start[(int)local_218._M_dataplus._M_p]->haveOrt_ == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (local_1f8->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar5,pcVar5 + (local_1f8->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,": ghost atom must be a directional atom\n",0x28);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)local_248);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      if ((int *)local_1f0._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        local_1f0.field_2._M_allocated_capacity - (long)local_1f0._M_dataplus._M_p);
      }
      uVar15 = uVar15 + 1;
      ppBVar11 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x100000000;
    } while (uVar15 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11 >> 3
                             ));
  }
  ppBVar11 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar11) {
    uVar15 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,&ppBVar11[(int)uVar15]->members_);
      local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1d0,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_248,(allocator_type *)&local_218);
      if (local_1f0._M_dataplus._M_p != (pointer)local_1f0._M_string_length) {
        piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var10._M_p = local_1f0._M_dataplus._M_p;
        do {
          lVar16 = (long)piVar4[*(int *)_Var10._M_p];
          if ((-1 < lVar16) &&
             (iVar1 = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16],
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar16] = iVar1 + 1, 1 < iVar1)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Fragment ",0x12);
            pcVar5 = (this->Name).data_._M_dataplus._M_p;
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,": bend",6);
            containerToString<std::vector<int,std::allocator<int>>>
                      (&local_218,(OpenMD *)&local_1f0,cont);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,local_218._M_dataplus._M_p,local_218._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"has three atoms on the same rigid body\n",0x27);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
            }
            pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar14,(string *)local_248);
            __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var10._M_p = _Var10._M_p + 4;
        } while (_Var10._M_p != (pointer)local_1f0._M_string_length);
      }
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_1f0._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        local_1f0.field_2._M_allocated_capacity - (long)local_1f0._M_dataplus._M_p);
      }
      uVar15 = uVar15 + 1;
      ppBVar11 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11 >> 3
                             ));
  }
  local_248._24_8_ = local_248 + 8;
  local_248._8_8_ = local_248._8_8_ & 0xffffffff00000000;
  local_248._16_8_ = 0;
  local_220 = 0;
  ppBVar11 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_228 = (_Base_ptr)local_248._24_8_;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar11) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      lVar3 = *(long *)((long)ppBVar11 + (lVar16 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1d0,(vector<int,_std::allocator<int>_> *)(lVar3 + 0x98));
      if ((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        local_218._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar3 + 0x94);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_218);
        if (_Var7._M_current !=
            local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::vector<int,_std::allocator<int>_>::insert
                    (&local_1d0,(const_iterator)_Var7._M_current,(value_type_conflict1 *)&local_218)
          ;
        }
      }
      _Var2._M_head_impl =
           local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
      local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
           = *local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
      local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
      super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)_Var2._M_head_impl;
      if (_Var2._M_head_impl <
          local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl) {
        local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)
             (_Head_base<2UL,_int,_false>)
             local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
             _M_head_impl;
        local_1b4.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = _Var2._M_head_impl;
      }
      iVar12 = std::
               _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       *)local_248,&local_1b4);
      if (iVar12._M_node != (_Base_ptr)(local_248 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_218._M_dataplus._M_p,
                             local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Bend",4);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_1f0,(OpenMD *)&local_1d0,cont_02);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," appears multiple times\n",0x18)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,&local_218);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
      ::_M_insert_unique<std::tuple<int,int,int>const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                  *)local_248,&local_1b4);
      if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar15 = uVar15 + 1;
      ppBVar11 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x100000000;
    } while (uVar15 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11 >> 3
                             ));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
               *)local_248);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FragmentStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp         = getBendStamp(i);
      std::vector<int> bendAtoms   = bendStamp->getMembers();
      std::vector<int>::iterator j = std::find_if(
          bendAtoms.begin(), bendAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Fragment " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Fragment " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Fragment " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Fragment " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Fragment " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Fragment " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure bendTuple.first is always less than or equal to
      // bendTuple.third
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Fragment " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }
  }